

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

void __thiscall helics::InputInfo::removeSource(InputInfo *this,string_view sourceName,Time minTime)

{
  pointer psVar1;
  pointer pvVar2;
  pointer pdVar3;
  pointer pTVar4;
  bool bVar5;
  size_t ii;
  ulong uVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  (this->inputUnits)._M_string_length = 0;
  *(this->inputUnits)._M_dataplus._M_p = '\0';
  (this->inputType)._M_string_length = 0;
  *(this->inputType)._M_dataplus._M_p = '\0';
  for (uVar6 = 0;
      psVar1 = (this->source_info).
               super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->source_info).
                             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) / 0x60);
      uVar6 = uVar6 + 1) {
    __y._M_str = psVar1[uVar6].key._M_dataplus._M_p;
    __y._M_len = psVar1[uVar6].key._M_string_length;
    bVar5 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)sourceName,__y);
    if (bVar5) {
      while( true ) {
        pvVar2 = (this->data_queues).
                 super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = *(pointer *)
                  ((long)&pvVar2[uVar6].
                          super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if ((pvVar2[uVar6].
             super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
             ._M_impl.super__Vector_impl_data._M_start == pdVar3) ||
           (pdVar3[-1].time.internalTimeCode <= minTime.internalTimeCode)) break;
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        pop_back(pvVar2 + uVar6);
      }
      pTVar4 = (this->deactivated).
               super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (minTime.internalTimeCode < pTVar4[uVar6].internalTimeCode) {
        pTVar4[uVar6].internalTimeCode = minTime.internalTimeCode;
      }
    }
  }
  return;
}

Assistant:

void InputInfo::removeSource(std::string_view sourceName, Time minTime)
{
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < source_info.size(); ++ii) {
        if (source_info[ii].key == sourceName) {
            while ((!data_queues[ii].empty()) && (data_queues[ii].back().time > minTime)) {
                data_queues[ii].pop_back();
            }
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}